

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::HLPOverlay::check_fwd_timings(HLPOverlay *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  short sVar6;
  HLPBindingMap *pHVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint16_t _i;
  undefined4 local_2c;
  ushort local_28;
  ushort local_26;
  Atom a;
  uint16_t index;
  uint16_t i;
  uint16_t guard_count;
  uint16_t guard_set_index;
  uint16_t bm_fwd_before_index;
  uint16_t bm_fwd_after_index;
  int16_t fwd_before_guard_index;
  int16_t fwd_after_guard_index;
  HLPOverlay *this_local;
  
  guard_set_index = 0xffff;
  guard_count = 0xffff;
  pHVar7 = core::P<r_exec::HLPBindingMap>::operator->(&this->bindings);
  uVar4 = BindingMap::get_fwd_after_index(&pHVar7->super_BindingMap);
  pHVar7 = core::P<r_exec::HLPBindingMap>::operator->(&this->bindings);
  uVar5 = BindingMap::get_fwd_before_index(&pHVar7->super_BindingMap);
  sVar6 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  _a = (ushort)bVar1;
  for (local_26 = 1; local_26 <= _a; local_26 = local_26 + 1) {
    local_28 = sVar6 + local_26;
    local_2c = *(undefined4 *)((this->super_Overlay).code + (ulong)local_28 * 4);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x73) {
      bVar1 = r_code::Atom::asAssignmentIndex();
      if (bVar1 == uVar4) {
        guard_set_index = local_26;
      }
      if (bVar1 == uVar5) {
        guard_count = local_26;
      }
    }
    r_code::Atom::~Atom((Atom *)&local_2c);
  }
  bVar3 = evaluate(this,sVar6 + guard_count);
  if (bVar3) {
    pHVar7 = core::P<r_exec::HLPBindingMap>::operator->(&this->bindings);
    uVar8 = BindingMap::get_fwd_before(&pHVar7->super_BindingMap);
    uVar9 = (*Now)();
    if (uVar9 < uVar8) {
      bVar3 = evaluate(this,sVar6 + guard_set_index);
      if (bVar3) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HLPOverlay::check_fwd_timings()
{
    int16_t fwd_after_guard_index = -1;
    int16_t fwd_before_guard_index = -1;
    uint16_t bm_fwd_after_index = bindings->get_fwd_after_index();
    uint16_t bm_fwd_before_index = bindings->get_fwd_before_index();
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) { // find the relevant guards.
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        if (a.getDescriptor() == Atom::ASSIGN_PTR) {
            uint16_t _i = a.asAssignmentIndex();

            if (_i == bm_fwd_after_index) {
                fwd_after_guard_index = i;
            }

            if (_i == bm_fwd_before_index) {
                fwd_before_guard_index = i;
            }
        }
    }

    if (!evaluate(guard_set_index + fwd_before_guard_index)) {
        return false;
    }

    if (bindings->get_fwd_before() <= Now()) {
        return false;
    }

    if (!evaluate(guard_set_index + fwd_after_guard_index)) {
        return false;
    }

    return true;
}